

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O0

int anon_unknown.dwarf_8326cb::FixedVecSize(char *arg)

{
  bool bVar1;
  int iVar2;
  char *local_18;
  char *arg_local;
  
  local_18 = arg;
  while( true ) {
    bVar1 = IsEndOfArg(local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return 0;
    }
    iVar2 = isdigit((int)*local_18);
    if (iVar2 != 0) break;
    local_18 = local_18 + 1;
  }
  return *local_18 + -0x30;
}

Assistant:

int FixedVecSize(const char* arg)
{
    while (!IsEndOfArg(arg)) {
        if (isdigit(*arg))
            return *arg - '0';
        ++arg;
    }

    return 0; // none found.
}